

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_1::GetExtractInsertValueType
          (ValidationState_t *_,Instruction *inst,uint32_t *member_type)

{
  ushort uVar1;
  uint16_t uVar2;
  pointer puVar3;
  uint32_t *puVar4;
  bool bVar5;
  uint32_t uVar6;
  int32_t iVar7;
  DiagnosticStream *pDVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint64_t array_size;
  char *local_220;
  uint32_t *local_218;
  ulong local_210;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  local_218 = member_type;
  if (1 < uVar1 - 0x51) {
    __assert_fail("opcode == spv::Op::OpCompositeExtract || opcode == spv::Op::OpCompositeInsert",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                  ,0x26,
                  "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                 );
  }
  uVar15 = uVar1 == 0x51 ^ 5;
  puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (ulong)((long)(inst->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar3) >> 2;
  uVar13 = (uint)uVar14;
  if (uVar13 == uVar15) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Expected at least one index to Op",0x21);
    local_220 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar8 = DiagnosticStream::operator<<(&local_208,&local_220);
    pcVar12 = ", zero found";
    lVar11 = 0xc;
  }
  else {
    if (uVar13 - uVar15 < 0x100) {
      uVar16 = (ulong)uVar15;
      uVar6 = ValidationState_t::GetTypeId(_,puVar3[uVar16 - 1]);
      puVar4 = local_218;
      *local_218 = uVar6;
      if (uVar6 != 0) {
        if (uVar13 <= uVar15) {
          return SPV_SUCCESS;
        }
        local_210 = uVar14 & 0xffffffff;
        do {
          uVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar16];
          pIVar9 = ValidationState_t::FindDef(_,*puVar4);
          if (pIVar9 == (Instruction *)0x0) {
            __assert_fail("type_inst",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                          ,0x42,
                          "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                         );
          }
          uVar2 = (pIVar9->inst_).opcode;
          switch(uVar2) {
          case 0x17:
            puVar3 = (pIVar9->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *puVar4 = puVar3[2];
            if (puVar3[3] <= uVar13) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Vector access is out of bounds, vector size is ",
                         0x2f);
LAB_001b1fba:
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar12 = ", but access index is ";
              lVar11 = 0x16;
LAB_001b1fcb:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,pcVar12,lVar11);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              goto LAB_001b1c7a;
            }
            break;
          case 0x18:
            puVar3 = (pIVar9->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *puVar4 = puVar3[2];
            if (puVar3[3] <= uVar13) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Matrix access is out of bounds, matrix has ",0x2b);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar12 = " columns, but access index is ";
              lVar11 = 0x1e;
              goto LAB_001b1fcb;
            }
            break;
          case 0x19:
          case 0x1a:
          case 0x1b:
            goto switchD_001b1d05_caseD_19;
          case 0x1c:
            local_220 = (char *)0x0;
            pIVar10 = ValidationState_t::FindDef
                                (_,(pIVar9->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[3]);
            *puVar4 = (pIVar9->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[2];
            iVar7 = spvOpcodeIsSpecConstant((uint)(pIVar10->inst_).opcode);
            if (iVar7 == 0) {
              bVar5 = ValidationState_t::EvalConstantValUint64
                                (_,(pIVar9->words_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[3],
                                 (uint64_t *)&local_220);
              if (!bVar5) {
                __assert_fail("0 && \"Array type definition is corrupt\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_composites.cpp"
                              ,0x62,
                              "spv_result_t spvtools::val::(anonymous namespace)::GetExtractInsertValueType(ValidationState_t &, const Instruction *, uint32_t *)"
                             );
              }
              if (local_220 <= (char *)(ulong)uVar13) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Array access is out of bounds, array size is ",
                           0x2d);
                goto LAB_001b1fba;
              }
            }
            break;
          case 0x1d:
switchD_001b1d05_caseD_1d:
            *puVar4 = (pIVar9->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[2];
            break;
          case 0x1e:
            puVar3 = (pIVar9->words_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((char *)(((long)(pIVar9->words_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) - 2U)
                <= (char *)(ulong)uVar13) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Index is out of bounds, can not find index ",0x2b);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," in the structure <id> \'",0x18);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"\'. This structure has ",0x16);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208," members. Largest valid index is ",0x21);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
              goto LAB_001b1c7a;
            }
            *puVar4 = puVar3[uVar13 + 2];
            break;
          default:
            if ((uVar2 == 0x1168) || (uVar2 == 0x14ee)) goto switchD_001b1d05_caseD_1d;
switchD_001b1d05_caseD_19:
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar12 = "Reached non-composite type while indexes still remain to be traversed.";
            lVar11 = 0x46;
            goto LAB_001b1e1d;
          }
          uVar16 = uVar16 + 1;
          if (local_210 == uVar16) {
            return SPV_SUCCESS;
          }
        } while( true );
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Expected Composite to be an object of composite type";
      lVar11 = 0x34;
LAB_001b1e1d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar12,lVar11);
      goto LAB_001b1c7a;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"The number of indexes in Op",0x1b);
    local_220 = spvOpcodeString((uint)uVar1);
    pDVar8 = DiagnosticStream::operator<<(&local_208,&local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8," may not exceed ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8,". Found ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
    pcVar12 = " indexes.";
    lVar11 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8,pcVar12,lVar11);
  local_208.error_ = pDVar8->error_;
LAB_001b1c7a:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t GetExtractInsertValueType(ValidationState_t& _,
                                       const Instruction* inst,
                                       uint32_t* member_type) {
  const spv::Op opcode = inst->opcode();
  assert(opcode == spv::Op::OpCompositeExtract ||
         opcode == spv::Op::OpCompositeInsert);
  uint32_t word_index = opcode == spv::Op::OpCompositeExtract ? 4 : 5;
  const uint32_t num_words = static_cast<uint32_t>(inst->words().size());
  const uint32_t composite_id_index = word_index - 1;
  const uint32_t num_indices = num_words - word_index;
  const uint32_t kCompositeExtractInsertMaxNumIndices = 255;

  if (num_indices == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected at least one index to Op"
           << spvOpcodeString(inst->opcode()) << ", zero found";

  } else if (num_indices > kCompositeExtractInsertMaxNumIndices) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The number of indexes in Op" << spvOpcodeString(opcode)
           << " may not exceed " << kCompositeExtractInsertMaxNumIndices
           << ". Found " << num_indices << " indexes.";
  }

  *member_type = _.GetTypeId(inst->word(composite_id_index));
  if (*member_type == 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Composite to be an object of composite type";
  }

  for (; word_index < num_words; ++word_index) {
    const uint32_t component_index = inst->word(word_index);
    const Instruction* const type_inst = _.FindDef(*member_type);
    assert(type_inst);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeVector: {
        *member_type = type_inst->word(2);
        const uint32_t vector_size = type_inst->word(3);
        if (component_index >= vector_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Vector access is out of bounds, vector size is "
                 << vector_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeMatrix: {
        *member_type = type_inst->word(2);
        const uint32_t num_cols = type_inst->word(3);
        if (component_index >= num_cols) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Matrix access is out of bounds, matrix has " << num_cols
                 << " columns, but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeArray: {
        uint64_t array_size = 0;
        auto size = _.FindDef(type_inst->word(3));
        *member_type = type_inst->word(2);
        if (spvOpcodeIsSpecConstant(size->opcode())) {
          // Cannot verify against the size of this array.
          break;
        }

        if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
          assert(0 && "Array type definition is corrupt");
        }
        if (component_index >= array_size) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Array access is out of bounds, array size is "
                 << array_size << ", but access index is " << component_index;
        }
        break;
      }
      case spv::Op::OpTypeRuntimeArray: {
        *member_type = type_inst->word(2);
        // Array size is unknown.
        break;
      }
      case spv::Op::OpTypeStruct: {
        const size_t num_struct_members = type_inst->words().size() - 2;
        if (component_index >= num_struct_members) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Index is out of bounds, can not find index "
                 << component_index << " in the structure <id> '"
                 << type_inst->id() << "'. This structure has "
                 << num_struct_members << " members. Largest valid index is "
                 << num_struct_members - 1 << ".";
        }
        *member_type = type_inst->word(component_index + 2);
        break;
      }
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeMatrixNV: {
        *member_type = type_inst->word(2);
        break;
      }
      default:
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Reached non-composite type while indexes still remain to "
                  "be traversed.";
    }
  }

  return SPV_SUCCESS;
}